

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_regexp_Symbol_replace(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  void *pvVar1;
  JSShape *sh;
  JSValue val;
  JSValue JVar2;
  JSValue JVar3;
  int iVar4;
  BOOL unicode;
  int iVar5;
  BOOL BVar6;
  uint uVar7;
  JSValueUnion JVar9;
  JSValueUnion JVar10;
  JSValueUnion *pJVar11;
  JSValueUnion *pJVar12;
  uint uVar8;
  ulong uVar13;
  undefined4 in_register_0000000c;
  long lVar14;
  size_t size;
  JSValueUnion JVar15;
  int64_t extraout_RDX;
  byte bVar16;
  int64_t iVar17;
  uint uVar18;
  uint32_t to;
  JSValueUnion JVar19;
  ulong uVar20;
  int64_t iVar21;
  bool bVar22;
  JSValue v;
  JSValue v_00;
  JSValue this_obj;
  JSValue obj;
  JSValue v_01;
  JSValue obj_00;
  JSValue obj_01;
  JSValue v_02;
  JSValue this_val_00;
  JSValue v_03;
  JSValue this_val_01;
  JSValue v_04;
  JSValue v_05;
  JSValue v_06;
  JSValue v_07;
  JSValue v_08;
  JSValue v_09;
  JSValue v_10;
  JSValue JVar23;
  JSValue JVar24;
  JSValue JVar25;
  JSValue JVar26;
  JSValue JVar27;
  JSValue JVar28;
  JSValue JVar29;
  JSValue JVar30;
  JSValue s;
  JSValue obj_02;
  JSValue val_00;
  JSValue this_obj_00;
  JSValue this_obj_01;
  JSValue val_01;
  JSValue val_02;
  int64_t position;
  uint32_t nCaptures;
  int64_t thisIndex;
  ValueBuffer v_b;
  int64_t local_1d8;
  JSValueUnion local_1d0;
  int64_t local_1c8;
  int64_t local_1c0;
  JSValueUnion local_1b8;
  ulong local_1b0;
  int64_t local_1a8;
  JSValueUnion local_1a0;
  int64_t iStack_198;
  long local_190;
  JSValueUnion local_188;
  int64_t local_180;
  ulong local_178;
  JSValueUnion local_170;
  JSValueUnion local_168;
  JSValueUnion local_160;
  ulong local_158;
  JSValueUnion local_150;
  JSValueUnion local_148;
  int local_140;
  uint local_13c;
  JSValueUnion local_138;
  int64_t local_130;
  JSValueUnion local_128;
  int64_t local_120;
  ulong local_118;
  undefined8 local_110;
  JSValueUnion local_108;
  int64_t local_100;
  JSValueUnion local_f8;
  JSValueUnion local_f0;
  JSValueUnion local_e8;
  int64_t local_e0;
  JSValueUnion local_d0;
  int64_t local_c8;
  StringBuffer local_c0;
  ulong local_a0;
  JSValueUnion local_98;
  ValueBuffer local_90;
  
  JVar19 = this_val.u;
  if ((int)this_val.tag != -1) {
    JVar19.float64 = 0.0;
    JS_ThrowTypeError(ctx,"not an object",this_val.tag,CONCAT44(in_register_0000000c,argc));
    iVar21 = 6;
    goto LAB_00140fb1;
  }
  JVar9 = (JSValueUnion)argv[1].u.ptr;
  local_c8 = argv[1].tag;
  local_c0.len = 0;
  local_c0.size = 0;
  local_c0.is_wide_char = 0;
  local_c0.error_status = 0;
  local_c0.ctx = ctx;
  local_c0.str = js_alloc_string(ctx,0,0);
  if (local_c0.str == (JSString *)0x0) {
    local_c0._16_8_ = local_c0._16_8_ & 0xffffffff;
    local_c0.error_status = -1;
  }
  local_90.arr = local_90.def;
  local_90.len = 0;
  local_90.size = 4;
  local_90.error_status = 0;
  local_148.ptr = (void *)((ulong)(uint)local_148._4_4_ << 0x20);
  local_168.ptr = (void *)((ulong)(uint)local_168._4_4_ << 0x20);
  local_90.ctx = ctx;
  JVar24 = JS_ToStringInternal(ctx,*argv,0);
  iVar17 = local_c8;
  local_180 = JVar24.tag;
  local_160 = JVar24.u;
  iVar21 = 6;
  if ((int)JVar24.tag == 6) {
    JVar30 = (JSValue)(ZEXT816(6) << 0x40);
    uVar20 = 0;
    JVar28 = (JSValue)(ZEXT816(3) << 0x40);
    JVar29 = (JSValue)(ZEXT816(3) << 0x40);
    JVar27 = (JSValue)(ZEXT816(3) << 0x40);
    local_1b0 = 3;
    JVar26.tag = 3;
    JVar26.u.ptr = local_168.ptr;
    JVar25.tag = 3;
    JVar25.u.ptr = local_148.ptr;
LAB_00141d8a:
    local_1c0 = JVar25.tag;
    local_148 = JVar25.u;
    local_1a8 = JVar26.tag;
    local_168 = JVar26.u;
    local_1c8 = JVar29.tag;
    local_188 = JVar29.u;
    local_180 = JVar24.tag;
    local_160 = JVar24.u;
    (*((local_c0.ctx)->rt->mf).js_free)(&(local_c0.ctx)->rt->malloc_state,local_c0.str);
    local_c0.str = (JSString *)0x0;
  }
  else {
    JVar30.tag = local_c8;
    JVar30.u.ptr = JVar9.ptr;
    local_150 = local_160;
    local_140 = JS_IsFunction(ctx,JVar30);
    local_98 = JVar9;
    if (local_140 == 0) {
      JVar27.tag = iVar17;
      JVar27.u.ptr = JVar9.ptr;
      JVar25 = JS_ToStringInternal(ctx,JVar27,0);
      local_148 = JVar25.u;
      if ((int)JVar25.tag != 6) goto LAB_00141166;
      JVar30 = (JSValue)(ZEXT816(6) << 0x40);
      uVar20 = 0;
LAB_00141d70:
      JVar24.tag = local_180;
      JVar24.u.float64 = local_160.float64;
      JVar29 = (JSValue)(ZEXT816(3) << 0x40);
      JVar27 = (JSValue)(ZEXT816(3) << 0x40);
      local_1b0 = 3;
      JVar26.tag = 3;
      JVar26.u.float64 = local_168.float64;
      JVar28 = (JSValue)(ZEXT816(3) << 0x40);
      goto LAB_00141d8a;
    }
    JVar25 = (JSValue)(ZEXT816(3) << 0x40);
LAB_00141166:
    local_1c0 = JVar25.tag;
    JVar24 = JS_GetPropertyInternal(ctx,this_val,0x6e,this_val,0);
    iVar4 = JS_ToBoolFree(ctx,JVar24);
    if (iVar4 < 0) {
LAB_00141d43:
      JVar30 = (JSValue)(ZEXT816(6) << 0x40);
      uVar20 = 0;
LAB_00141d46:
      JVar25.tag = local_1c0;
      JVar25.u.float64 = local_148.float64;
      goto LAB_00141d70;
    }
    if (iVar4 == 0) {
      unicode = 0;
    }
    else {
      JVar24 = JS_GetPropertyInternal(ctx,this_val,0x6f,this_val,0);
      unicode = JS_ToBoolFree(ctx,JVar24);
      if ((unicode < 0) ||
         (iVar5 = JS_SetPropertyInternal(ctx,this_val,0x55,(JSValue)ZEXT816(0),0x4000), iVar5 < 0))
      goto LAB_00141d43;
    }
    if (((JVar25.u.ptr != (void *)0x0) && (iVar4 != 0)) &&
       ((*(ulong *)((long)JVar25.u.ptr + 4) & 0x7fffffff) == 0)) {
      JVar24 = JS_GetPropertyInternal(ctx,this_val,0x3c,this_val,0);
      JVar9 = JVar24.u;
      if ((uint)JVar24.tag != 6) {
        BVar6 = js_same_value(ctx,JVar24,ctx->regexp_ctor);
        local_138 = JVar9;
        if ((0xfffffff4 < (uint)JVar24.tag) &&
           (iVar5 = *JVar9.ptr, *(int *)JVar9.ptr = iVar5 + -1, iVar5 < 2)) {
          __JS_FreeValueRT(ctx->rt,JVar24);
        }
        if (BVar6 == 0) goto LAB_00141353;
        JVar24 = JS_GetPropertyInternal(ctx,this_val,0x86,this_val,0);
        JVar9 = JVar24.u;
        if ((JVar24.tag & 0xffffffffU) != 6) {
          bVar22 = true;
          if ((((uint)JVar24.tag == 0xffffffff) && (*(short *)((long)JVar9.ptr + 6) == 0xc)) &&
             (*(code **)((long)JVar9.ptr + 0x38) == js_regexp_exec)) {
            bVar22 = *(short *)((long)JVar9.ptr + 0x42) != 0;
          }
          local_138 = JVar9;
          if ((0xfffffff4 < (uint)JVar24.tag) &&
             (iVar5 = *JVar9.ptr, *(int *)JVar9.ptr = iVar5 + -1, iVar5 < 2)) {
            __JS_FreeValueRT(ctx->rt,JVar24);
          }
          if (bVar22) goto LAB_00141353;
        }
      }
      JVar28.tag = local_180;
      JVar28.u.ptr = local_160.ptr;
      JVar30 = JS_RegExpDelete(ctx,this_val,JVar28);
      uVar20 = (ulong)JVar30.u.ptr & 0xffffffff00000000;
      goto LAB_00141d46;
    }
LAB_00141353:
    JVar9 = local_160;
    JVar3.tag = 3;
    JVar3.u.float64 = local_168.float64;
    do {
      local_1a8 = JVar3.tag;
      iVar17 = local_1a8;
      local_168 = JVar3.u;
      s.tag = local_180;
      s.u.ptr = JVar9.ptr;
      JVar24 = JS_RegExpExec(ctx,this_val,s);
      JVar26.tag = local_1a8;
      JVar26.u.ptr = local_168.ptr;
      JVar2.tag = local_1a8;
      JVar2.u.ptr = local_168.ptr;
      JVar10 = JVar24.u;
      uVar8 = (uint)JVar24.tag;
      if (uVar8 == 2) {
        uVar18 = 4;
      }
      else {
        uVar18 = 2;
        JVar26 = JVar2;
        if (uVar8 != 6) {
          if (local_90.error_status == 0) {
            if (local_90.size <= local_90.len) {
              uVar7 = local_90.len + (local_90.len >> 1) + 0x1f;
              size = (long)(int)(uVar7 & 0xffffffef) << 4;
              if (local_90.arr == local_90.def) {
                pJVar12 = (JSValueUnion *)
                          js_realloc2(local_90.ctx,(void *)0x0,size,(size_t *)&local_1a0.int32);
                pJVar11 = (JSValueUnion *)0x0;
                if (pJVar12 != (JSValueUnion *)0x0) {
                  pJVar12[6] = local_90.def[3].u;
                  pJVar12[7] = (JSValueUnion)local_90.def[3].tag;
                  pJVar12[4] = local_90.def[2].u;
                  pJVar12[5] = (JSValueUnion)local_90.def[2].tag;
                  pJVar12[2] = local_90.def[1].u;
                  pJVar12[3] = (JSValueUnion)local_90.def[1].tag;
                  *pJVar12 = local_90.def[0].u;
                  pJVar12[1] = (JSValueUnion)local_90.def[0].tag;
                  pJVar11 = pJVar12;
                }
              }
              else {
                pJVar11 = (JSValueUnion *)
                          js_realloc2(local_90.ctx,local_90.arr,size,(size_t *)&local_1a0.int32);
              }
              if (pJVar11 == (JSValueUnion *)0x0) {
                value_buffer_free(&local_90);
                local_138 = JVar10;
                if ((0xfffffff4 < uVar8) &&
                   (iVar5 = *JVar10.ptr, *(int *)JVar10.ptr = iVar5 + -1, iVar5 < 2)) {
                  __JS_FreeValueRT((local_90.ctx)->rt,JVar24);
                }
                local_90.error_status = -1;
              }
              else {
                local_90.size = (uVar7 & 0xffffffef) + (int)((ulong)local_1a0.ptr >> 4);
                local_90.arr = (JSValue *)pJVar11;
              }
              if (pJVar11 == (JSValueUnion *)0x0) goto LAB_001413a3;
            }
            lVar14 = (long)local_90.len;
            local_90.len = local_90.len + 1;
            ((JSValueUnion *)((long)local_90.arr + lVar14 * 2 * 8))->ptr = (void *)JVar10;
            *(int64_t *)((long)local_90.arr + (lVar14 * 2 + 1) * 8) = JVar24.tag;
            bVar16 = 1;
          }
          else {
LAB_001413a3:
            bVar16 = 0;
          }
          JVar26.u.ptr = local_168.ptr;
          if (bVar16 == 1 && iVar4 != 0) {
            local_138.float64 = local_168.float64;
            local_1a8._0_4_ = (uint)JVar3.tag;
            if ((0xfffffff4 < (uint)local_1a8) &&
               (iVar5 = *local_168.ptr, *(int *)local_168.ptr = iVar5 + -1, iVar5 < 2)) {
              v.tag = iVar17;
              v.u.ptr = local_168.ptr;
              __JS_FreeValueRT(ctx->rt,v);
            }
            JVar24 = JS_GetPropertyValue(ctx,JVar24,(JSValue)ZEXT816(0));
            JVar26 = JS_ToStringFree(ctx,JVar24);
            uVar20 = JVar26.tag;
            local_168 = JVar26.u;
            if ((uVar20 & 0xffffffff) != 6) {
              local_138 = local_168;
              if (((int)JVar26.tag == -7) &&
                 ((*(ulong *)((long)local_168.ptr + 4) & 0x7fffffff) == 0)) {
                JVar24 = JS_GetPropertyInternal(ctx,this_val,0x55,this_val,0);
                iVar5 = JS_ToLengthFree(ctx,(int64_t *)&local_138.int32,JVar24);
                if (iVar5 < 0) {
                  uVar18 = 2;
                  bVar22 = false;
                }
                else {
                  uVar13 = string_advance_index
                                     ((JSString *)local_150.ptr,(int64_t)local_138,unicode);
                  bVar22 = (long)(int)uVar13 == uVar13;
                  JVar10.float64 = (double)(long)uVar13;
                  if (bVar22) {
                    JVar10.ptr = (void *)(uVar13 & 0xffffffff);
                  }
                  iVar17 = 7;
                  if (bVar22) {
                    iVar17 = 0;
                  }
                  val_00.tag = iVar17;
                  val_00.u.float64 = JVar10.float64;
                  uVar8 = JS_SetPropertyInternal(ctx,this_val,0x55,val_00,0x4000);
                  bVar22 = -1 < (int)uVar8;
                  uVar18 = uVar8 >> 0x1e & 0xfffffffe;
                }
                JVar26.tag = uVar20;
                JVar26.u.ptr = local_168.ptr;
                if (!bVar22) goto LAB_0014169a;
              }
              JVar26.tag = uVar20;
              JVar26.u.float64 = local_168.float64;
              uVar18 = 0;
            }
          }
          else {
            uVar18 = (uint)bVar16 * 2 + 2;
          }
        }
      }
LAB_0014169a:
      JVar25.tag = local_1c0;
      JVar25.u.ptr = local_148.ptr;
      JVar24.tag = local_180;
      JVar24.u.ptr = local_160.ptr;
      JVar3 = JVar26;
    } while (uVar18 == 0);
    if (uVar18 == 2) {
      JVar30 = (JSValue)(ZEXT816(6) << 0x40);
      uVar20 = 0;
      JVar28 = (JSValue)(ZEXT816(3) << 0x40);
      JVar29 = (JSValue)(ZEXT816(3) << 0x40);
      JVar27 = (JSValue)(ZEXT816(3) << 0x40);
      local_1b0 = 3;
      goto LAB_00141d8a;
    }
    if (uVar18 != 4) goto LAB_00140fb1;
    if (local_90.len < 1) {
      local_158 = 0;
      JVar28 = (JSValue)(ZEXT816(3) << 0x40);
      JVar29 = (JSValue)(ZEXT816(3) << 0x40);
      JVar27 = (JSValue)(ZEXT816(3) << 0x40);
      local_1b0 = 3;
    }
    else {
      lVar14 = 0;
      local_1b0 = 3;
      JVar27 = (JSValue)(ZEXT816(3) << 0x40);
      JVar29 = (JSValue)(ZEXT816(3) << 0x40);
      JVar28 = (JSValue)(ZEXT816(3) << 0x40);
      local_158 = 0;
      do {
        local_1a8 = JVar26.tag;
        iVar17 = local_1a8;
        local_168 = JVar26.u;
        local_1c8 = JVar29.tag;
        local_188 = JVar29.u;
        local_1d8 = JVar27.tag;
        local_1d0 = JVar27.u;
        JVar9 = (JSValueUnion)((JSValueUnion *)((long)local_90.arr + lVar14 * 2 * 8))->ptr;
        pvVar1 = ((JSValueUnion *)((long)local_90.arr + (lVar14 * 2 + 1) * 8))->ptr;
        obj_02.tag = (int64_t)pvVar1;
        obj_02.u.ptr = JVar9.ptr;
        local_190 = lVar14;
        iVar4 = js_get_length32(ctx,&local_13c,obj_02);
        uVar8 = 2;
        JVar19 = JVar9;
        if (iVar4 < 0) {
LAB_00141d1b:
          JVar26.tag = local_1a8;
          JVar26.u.ptr = local_168.ptr;
          JVar29.tag = local_1c8;
          JVar29.u.float64 = local_188.float64;
        }
        else {
          local_1a0.float64 = local_168.float64;
          local_1a8._0_4_ = (uint)JVar26.tag;
          if ((0xfffffff4 < (uint)local_1a8) &&
             (iVar4 = *local_168.ptr, *(int *)local_168.ptr = iVar4 + -1, iVar4 < 2)) {
            v_00.tag = iVar17;
            v_00.u.ptr = local_168.ptr;
            __JS_FreeValueRT(ctx->rt,v_00);
          }
          this_obj.tag = (int64_t)pvVar1;
          this_obj.u.ptr = JVar9.ptr;
          JVar24 = JS_GetPropertyValue(ctx,this_obj,(JSValue)ZEXT816(0));
          JVar26 = JS_ToStringFree(ctx,JVar24);
          JVar29.tag = local_1c8;
          JVar29.u.ptr = local_188.ptr;
          local_1a8 = JVar26.tag;
          local_168 = JVar26.u;
          uVar8 = (uint)JVar26.tag;
          if (uVar8 != 6) {
            obj.tag = (int64_t)pvVar1;
            obj.u.ptr = JVar9.ptr;
            this_obj_00.tag = (int64_t)pvVar1;
            this_obj_00.u.ptr = JVar9.ptr;
            local_d0 = local_168;
            JVar24 = JS_GetPropertyInternal(ctx,obj,0x57,this_obj_00,0);
            iVar4 = JS_ToLengthFree(ctx,(int64_t *)&local_170.int32,JVar24);
            JVar29.u.ptr = local_188.ptr;
            JVar26.tag = local_1a8;
            JVar26.u.ptr = local_168.ptr;
            if (iVar4 == 0) {
              JVar10._0_4_ = (uint)*(undefined8 *)((long)local_150.ptr + 4) & 0x7fffffff;
              JVar10._4_4_ = 0;
              if (((long)local_170.ptr <= (long)JVar10.ptr) &&
                 (JVar10 = local_170, (long)local_170.ptr < 0)) {
                local_170.float64 = 0.0;
                JVar10.float64 = local_170.float64;
              }
              local_170 = JVar10;
              v_01.u.ptr = (void *)((ulong)local_1d0.ptr & 0xffffffff | local_1b0 << 0x20);
              v_01.tag = local_1d8;
              JS_FreeValue(ctx,v_01);
              sh = ctx->array_shape;
              (sh->header).ref_count = (sh->header).ref_count + 1;
              JVar27 = JS_NewObjectFromShape(ctx,sh,2);
              JVar29.u.ptr = local_188.ptr;
              JVar26.u.ptr = local_168.ptr;
              local_1b0 = (ulong)JVar27.u.ptr >> 0x20;
              if ((int)JVar27.tag != 6) {
                if (0xfffffff4 < uVar8) {
                  *(int *)local_d0.ptr = *local_d0.ptr + 1;
                }
                local_1a0.float64 = local_d0.float64;
                val.tag = local_1a8;
                val.u.ptr = local_d0.ptr;
                iStack_198 = local_1a8;
                iVar4 = JS_DefinePropertyValueValue(ctx,JVar27,(JSValue)ZEXT816(0),val,0x4007);
                JVar29.u.ptr = local_188.ptr;
                JVar26.u.ptr = local_168.ptr;
                if (-1 < iVar4) {
                  local_a0 = (ulong)local_13c;
                  local_178 = 1;
                  if (1 < local_a0) {
                    local_178 = 1;
                    do {
                      obj_00.tag = (int64_t)pvVar1;
                      obj_00.u.ptr = JVar9.ptr;
                      JVar24 = JS_GetPropertyInt64(ctx,obj_00,local_178);
                      if ((int)JVar24.tag == 3) {
LAB_0014193d:
                        uVar8 = JS_DefinePropertyValueInt64(ctx,JVar27,local_178,JVar24,0x4007);
                        bVar22 = -1 < (int)uVar8;
                        uVar8 = uVar8 >> 0x1e & 0xfffffffe;
                      }
                      else {
                        uVar8 = 2;
                        if ((int)JVar24.tag != 6) {
                          JVar24 = JS_ToStringFree(ctx,JVar24);
                          if ((int)JVar24.tag != 6) goto LAB_0014193d;
                        }
                        bVar22 = false;
                      }
                      if (!bVar22) goto LAB_00141d1b;
                      local_178 = local_178 + 1;
                    } while (local_a0 != local_178);
                  }
                  local_1d8 = JVar27.tag;
                  JS_FreeValue(ctx,JVar28);
                  obj_01.tag = (int64_t)pvVar1;
                  obj_01.u.ptr = JVar9.ptr;
                  this_obj_01.tag = (int64_t)pvVar1;
                  this_obj_01.u.ptr = JVar9.ptr;
                  JVar28 = JS_GetPropertyInternal(ctx,obj_01,0x87,this_obj_01,0);
                  JVar29.u.ptr = local_188.ptr;
                  JVar26.u.ptr = local_168.ptr;
                  JVar10 = JVar28.u;
                  JVar15.ptr = (void *)(JVar28.tag & 0xffffffff);
                  JVar19.ptr = JVar15.ptr;
                  if ((JSValue *)JVar15.ptr != (JSValue *)0x6) {
                    uVar8 = (uint)JVar28.tag;
                    if (local_140 == 0) {
                      if (uVar8 == 3) {
                        uVar20 = 0;
                        JVar24 = (JSValue)(ZEXT816(3) << 0x40);
LAB_00141b8d:
                        JVar15 = (JSValueUnion)JVar24.tag;
                        local_138 = local_d0;
                        local_128.float64 = local_160.float64;
                        local_120 = local_180;
                        local_118 = (ulong)local_170.ptr & 0xffffffff;
                        local_110 = 0;
                        local_100 = local_1d8;
                        JVar19.ptr = (void *)((ulong)JVar24.u.ptr & 0xffffffff | uVar20);
                        local_e8.float64 = local_148.float64;
                        local_e0 = local_1c0;
                        v_03.tag = local_1c8;
                        v_03.u.ptr = local_188.ptr;
                        local_130 = local_1a8;
                        local_108 = JVar27.u;
                        local_f8.ptr = JVar19.ptr;
                        local_f0 = JVar15;
                        JS_FreeValue(ctx,v_03);
                        this_val_01.tag = extraout_RDX;
                        this_val_01.u.ptr = &local_138;
                        JVar24 = js_string___GetSubstitution
                                           (ctx,this_val_01,(int)uVar20,(JSValue *)JVar9.ptr);
                        local_1c8 = JVar24.tag;
                        local_188 = JVar24.u;
                        v_04.tag = (int64_t)JVar15.ptr;
                        v_04.u.ptr = JVar19.ptr;
                        JS_FreeValue(ctx,v_04);
                        uVar8 = 0;
                        bVar22 = true;
                      }
                      else {
                        JVar24 = JS_ToObject(ctx,JVar28);
                        JVar15 = (JSValueUnion)JVar24.tag;
                        if ((int)JVar24.tag != 6) {
                          uVar20 = (ulong)JVar24.u.ptr & 0xffffffff00000000;
                          goto LAB_00141b8d;
                        }
                        uVar8 = 2;
                        bVar22 = false;
                      }
                      JVar29.tag = local_1c8;
                      JVar29.u.ptr = local_188.ptr;
                      JVar19 = JVar15;
                      if (!bVar22) goto LAB_00141d1b;
LAB_00141c7b:
                      JVar19 = local_170;
                      v_05.tag = JVar29.tag;
                      local_188 = JVar29.u;
                      if ((int)JVar29.tag != 6) {
                        if ((long)(int)(uint32_t)local_158 <= (long)local_170.ptr) {
                          to = local_170.int32;
                          string_buffer_concat
                                    (&local_c0,(JSString *)local_150.ptr,(uint32_t)local_158,to);
                          v_05.u.ptr = local_188.ptr;
                          string_buffer_concat_value(&local_c0,v_05);
                          local_158 = (ulong)((*(uint *)((long)local_168.ptr + 4) & 0x7fffffff) + to
                                             );
                        }
                        JVar26.u.ptr = local_168.ptr;
                        JVar29.tag = v_05.tag;
                        JVar29.u.ptr = local_188.ptr;
                        uVar8 = 0;
                        goto LAB_00141d20;
                      }
                    }
                    else {
                      val_01.u = (ulong)local_170.ptr & 0xffffffff;
                      val_01.tag = 0;
                      iVar4 = JS_DefinePropertyValueInt64
                                        (ctx,JVar27,local_178 & 0xffffffff,val_01,0x4007);
                      JVar29.u.ptr = local_188.ptr;
                      JVar26.u.ptr = local_168.ptr;
                      if (iVar4 < 0) goto LAB_00141c8d;
                      local_1a0.float64 = local_160.float64;
                      if (0xfffffff4 < (uint)local_180) {
                        *(int *)local_160.ptr = *local_160.ptr + 1;
                      }
                      uVar18 = (int)local_178 + 1;
                      val_02.tag = local_180;
                      val_02.u.ptr = local_160.ptr;
                      iVar4 = JS_DefinePropertyValueInt64(ctx,JVar27,(ulong)uVar18,val_02,0x4007);
                      JVar29.u.ptr = local_188.ptr;
                      if (-1 < iVar4) {
                        if (uVar8 != 3) {
                          if (0xfffffff4 < uVar8) {
                            *(int *)JVar10.ptr = *JVar10.ptr + 1;
                          }
                          uVar18 = (int)local_178 + 2;
                          local_1a0 = JVar10;
                          iVar4 = JS_DefinePropertyValueInt64
                                            (ctx,JVar27,(ulong)uVar18,JVar28,0x4007);
                          JVar29.u.ptr = local_188.ptr;
                          if (iVar4 < 0) goto LAB_00141c85;
                        }
                        local_138.float64 = local_138.float64 & 0xffffffff00000000;
                        local_130 = 3;
                        v_02.tag = local_1c8;
                        v_02.u.ptr = local_188.ptr;
                        _local_128 = JVar27;
                        JS_FreeValue(ctx,v_02);
                        this_val_00.tag = local_c8;
                        this_val_00.u.float64 = local_98.float64;
                        JVar24 = js_function_apply(ctx,this_val_00,uVar18,(JSValue *)&local_138,0);
                        JVar29 = JS_ToStringFree(ctx,JVar24);
                        goto LAB_00141c7b;
                      }
                    }
LAB_00141c85:
                    JVar26.u.ptr = local_168.ptr;
                    JVar19 = JVar15;
                  }
                }
              }
            }
          }
LAB_00141c8d:
          uVar8 = 2;
        }
LAB_00141d20:
        JVar25.u.float64 = local_148.float64;
        JVar24.tag = local_180;
        JVar24.u.float64 = local_160.float64;
        if (uVar8 != 0) {
          if (uVar8 != 2) goto LAB_00140fb1;
          JVar30 = (JSValue)(ZEXT816(6) << 0x40);
          uVar20 = 0;
          goto LAB_00141d8a;
        }
        lVar14 = local_190 + 1;
      } while (lVar14 < local_90.len);
    }
    local_1c8 = JVar29.tag;
    local_188 = JVar29.u;
    local_1a8 = JVar26.tag;
    local_168 = JVar26.u;
    string_buffer_concat
              (&local_c0,(JSString *)local_150.ptr,(uint32_t)local_158,
               *(uint *)((long)local_150.ptr + 4) & 0x7fffffff);
    JVar30 = string_buffer_end(&local_c0);
    uVar20 = (ulong)JVar30.u.ptr & 0xffffffff00000000;
  }
  local_1b8 = JVar28.u;
  local_1d8 = JVar27.tag;
  local_1d0 = JVar27.u;
  iVar21 = JVar30.tag;
  value_buffer_free(&local_90);
  local_1a0.float64 = local_148.float64;
  if ((0xfffffff4 < (uint)local_1c0) &&
     (iVar4 = *local_148.ptr, *(int *)local_148.ptr = iVar4 + -1, iVar4 < 2)) {
    v_06.tag = local_1c0;
    v_06.u.ptr = local_148.ptr;
    __JS_FreeValueRT(ctx->rt,v_06);
  }
  local_1a0.float64 = local_168.float64;
  if ((0xfffffff4 < (uint)local_1a8) &&
     (iVar4 = *local_168.ptr, *(int *)local_168.ptr = iVar4 + -1, iVar4 < 2)) {
    v_07.tag = local_1a8;
    v_07.u.ptr = local_168.ptr;
    __JS_FreeValueRT(ctx->rt,v_07);
  }
  local_1a0.ptr = (void *)((ulong)local_1d0.ptr & 0xffffffff | local_1b0 << 0x20);
  if ((0xfffffff4 < (uint)JVar27.tag) &&
     (iVar4 = *local_1a0.ptr, *(int *)local_1a0.ptr = iVar4 + -1, iVar4 < 2)) {
    v_08.tag = local_1d8;
    v_08.u.ptr = local_1a0.ptr;
    __JS_FreeValueRT(ctx->rt,v_08);
  }
  local_1a0.float64 = local_188.float64;
  if ((0xfffffff4 < (uint)local_1c8) &&
     (iVar4 = *local_188.ptr, *(int *)local_188.ptr = iVar4 + -1, iVar4 < 2)) {
    v_09.tag = local_1c8;
    v_09.u.ptr = local_188.ptr;
    __JS_FreeValueRT(ctx->rt,v_09);
  }
  local_1a0.float64 = local_1b8.float64;
  if ((0xfffffff4 < (uint)JVar28.tag) &&
     (iVar4 = *local_1b8.ptr, *(int *)local_1b8.ptr = iVar4 + -1, iVar4 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar28);
  }
  local_1a0.float64 = local_160.float64;
  if ((0xfffffff4 < (uint)local_180) &&
     (iVar4 = *local_160.ptr, *(int *)local_160.ptr = iVar4 + -1, iVar4 < 2)) {
    v_10.tag = local_180;
    v_10.u.ptr = local_160.ptr;
    __JS_FreeValueRT(ctx->rt,v_10);
  }
  JVar19.ptr = (void *)(uVar20 | (ulong)JVar30.u.ptr & 0xffffffff);
LAB_00140fb1:
  JVar23.tag = iVar21;
  JVar23.u.float64 = JVar19.float64;
  return JVar23;
}

Assistant:

static JSValue js_regexp_Symbol_replace(JSContext *ctx, JSValueConst this_val,
                                        int argc, JSValueConst *argv)
{
    // [Symbol.replace](str, rep)
    JSValueConst rx = this_val, rep = argv[1];
    JSValueConst args[6];
    JSValue str, rep_val, matched, tab, rep_str, namedCaptures, res;
    JSString *sp, *rp;
    StringBuffer b_s, *b = &b_s;
    ValueBuffer v_b, *results = &v_b;
    int nextSourcePosition, n, j, functionalReplace, is_global, fullUnicode;
    uint32_t nCaptures;
    int64_t position;

    if (!JS_IsObject(rx))
        return JS_ThrowTypeErrorNotAnObject(ctx);

    string_buffer_init(ctx, b, 0);
    value_buffer_init(ctx, results);

    rep_val = JS_UNDEFINED;
    matched = JS_UNDEFINED;
    tab = JS_UNDEFINED;
    rep_str = JS_UNDEFINED;
    namedCaptures = JS_UNDEFINED;

    str = JS_ToString(ctx, argv[0]);
    if (JS_IsException(str))
        goto exception;
        
    sp = JS_VALUE_GET_STRING(str);
    rp = NULL;
    functionalReplace = JS_IsFunction(ctx, rep);
    if (!functionalReplace) {
        rep_val = JS_ToString(ctx, rep);
        if (JS_IsException(rep_val))
            goto exception;
        rp = JS_VALUE_GET_STRING(rep_val);
    }
    fullUnicode = 0;
    is_global = JS_ToBoolFree(ctx, JS_GetProperty(ctx, rx, JS_ATOM_global));
    if (is_global < 0)
        goto exception;
    if (is_global) {
        fullUnicode = JS_ToBoolFree(ctx, JS_GetProperty(ctx, rx, JS_ATOM_unicode));
        if (fullUnicode < 0)
            goto exception;
        if (JS_SetProperty(ctx, rx, JS_ATOM_lastIndex, JS_NewInt32(ctx, 0)) < 0)
            goto exception;
    }

    if (rp && rp->len == 0 && is_global && js_is_standard_regexp(ctx, rx)) {
        /* use faster version for simple cases */
        res = JS_RegExpDelete(ctx, rx, str);
        goto done;
    }
    for(;;) {
        JSValue result;
        result = JS_RegExpExec(ctx, rx, str);
        if (JS_IsException(result))
            goto exception;
        if (JS_IsNull(result))
            break;
        if (value_buffer_append(results, result) < 0)
            goto exception;
        if (!is_global)
            break;
        JS_FreeValue(ctx, matched);
        matched = JS_ToStringFree(ctx, JS_GetPropertyInt64(ctx, result, 0));
        if (JS_IsException(matched))
            goto exception;
        if (JS_IsEmptyString(matched)) {
            /* always advance of at least one char */
            int64_t thisIndex, nextIndex;
            if (JS_ToLengthFree(ctx, &thisIndex, JS_GetProperty(ctx, rx, JS_ATOM_lastIndex)) < 0)
                goto exception;
            nextIndex = string_advance_index(sp, thisIndex, fullUnicode);
            if (JS_SetProperty(ctx, rx, JS_ATOM_lastIndex, JS_NewInt64(ctx, nextIndex)) < 0)
                goto exception;
        }
    }
    nextSourcePosition = 0;
    for(j = 0; j < results->len; j++) {
        JSValueConst result;
        result = results->arr[j];
        if (js_get_length32(ctx, &nCaptures, result) < 0)
            goto exception;
        JS_FreeValue(ctx, matched);
        matched = JS_ToStringFree(ctx, JS_GetPropertyInt64(ctx, result, 0));
        if (JS_IsException(matched))
            goto exception;
        if (JS_ToLengthFree(ctx, &position, JS_GetProperty(ctx, result, JS_ATOM_index)))
            goto exception;
        if (position > sp->len)
            position = sp->len;
        else if (position < 0)
            position = 0;
        /* ignore substition if going backward (can happen
           with custom regexp object) */
        JS_FreeValue(ctx, tab);
        tab = JS_NewArray(ctx);
        if (JS_IsException(tab))
            goto exception;
        if (JS_DefinePropertyValueInt64(ctx, tab, 0, JS_DupValue(ctx, matched),
                                        JS_PROP_C_W_E | JS_PROP_THROW) < 0)
            goto exception;
        for(n = 1; n < nCaptures; n++) {
            JSValue capN;
            capN = JS_GetPropertyInt64(ctx, result, n);
            if (JS_IsException(capN))
                goto exception;
            if (!JS_IsUndefined(capN)) {
                capN = JS_ToStringFree(ctx, capN);
                if (JS_IsException(capN))
                    goto exception;
            }
            if (JS_DefinePropertyValueInt64(ctx, tab, n, capN,
                                            JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                goto exception;
        }
        JS_FreeValue(ctx, namedCaptures);
        namedCaptures = JS_GetProperty(ctx, result, JS_ATOM_groups);
        if (JS_IsException(namedCaptures))
            goto exception;
        if (functionalReplace) {
            if (JS_DefinePropertyValueInt64(ctx, tab, n++, JS_NewInt32(ctx, position), JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                goto exception;
            if (JS_DefinePropertyValueInt64(ctx, tab, n++, JS_DupValue(ctx, str), JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                goto exception;
            if (!JS_IsUndefined(namedCaptures)) {
                if (JS_DefinePropertyValueInt64(ctx, tab, n++, JS_DupValue(ctx, namedCaptures), JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                    goto exception;
            }
            args[0] = JS_UNDEFINED;
            args[1] = tab;
            JS_FreeValue(ctx, rep_str);
            rep_str = JS_ToStringFree(ctx, js_function_apply(ctx, rep, 2, args, 0));
        } else {
            JSValue namedCaptures1;
            if (!JS_IsUndefined(namedCaptures)) {
                namedCaptures1 = JS_ToObject(ctx, namedCaptures);
                if (JS_IsException(namedCaptures1))
                    goto exception;
            } else {
                namedCaptures1 = JS_UNDEFINED;
            }
            args[0] = matched;
            args[1] = str;
            args[2] = JS_NewInt32(ctx, position);
            args[3] = tab;
            args[4] = namedCaptures1;
            args[5] = rep_val;
            JS_FreeValue(ctx, rep_str);
            rep_str = js_string___GetSubstitution(ctx, JS_UNDEFINED, 6, args);
            JS_FreeValue(ctx, namedCaptures1);
        }
        if (JS_IsException(rep_str))
            goto exception;
        if (position >= nextSourcePosition) {
            string_buffer_concat(b, sp, nextSourcePosition, position);
            string_buffer_concat_value(b, rep_str);
            nextSourcePosition = position + JS_VALUE_GET_STRING(matched)->len;
        }
    }
    string_buffer_concat(b, sp, nextSourcePosition, sp->len);
    res = string_buffer_end(b);
    goto done1;

exception:
    res = JS_EXCEPTION;
done:
    string_buffer_free(b);
done1:
    value_buffer_free(results);
    JS_FreeValue(ctx, rep_val);
    JS_FreeValue(ctx, matched);
    JS_FreeValue(ctx, tab);
    JS_FreeValue(ctx, rep_str);
    JS_FreeValue(ctx, namedCaptures);
    JS_FreeValue(ctx, str);
    return res;
}